

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O0

void mbedtls_mpi_core_montmul
               (mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,mbedtls_mpi_uint *B,size_t B_limbs,
               mbedtls_mpi_uint *N,size_t AN_limbs,mbedtls_mpi_uint mm,mbedtls_mpi_uint *T)

{
  mbedtls_mpi_uint b;
  long lVar1;
  mbedtls_mpi_uint mVar2;
  uchar *in_RCX;
  mbedtls_mpi_uint *in_RDX;
  mbedtls_ct_condition_t in_RSI;
  mbedtls_mpi_uint *in_RDI;
  mbedtls_mpi_uint *in_R8;
  ulong in_R9;
  mbedtls_mpi_uint borrow;
  mbedtls_mpi_uint carry;
  mbedtls_mpi_uint u1;
  mbedtls_mpi_uint u0;
  size_t i;
  mbedtls_ct_uint_t x;
  undefined8 local_38;
  
  memset((void *)u1,0,(in_R9 * 2 + 1) * 8);
  for (local_38 = 0; local_38 < in_R9; local_38 = local_38 + 1) {
    b = *(mbedtls_mpi_uint *)(in_RSI + local_38 * 8);
    lVar1 = *(long *)u1;
    mVar2 = *in_RDX;
    mbedtls_mpi_core_mla((mbedtls_mpi_uint *)u1,in_R9 + 2,in_RDX,(size_t)in_RCX,b);
    mbedtls_mpi_core_mla((mbedtls_mpi_uint *)u1,in_R9 + 2,in_R8,in_R9,(lVar1 + b * mVar2) * carry);
    u1 = u1 + 8;
  }
  x = *(mbedtls_ct_uint_t *)(u1 + in_R9 * 8);
  mbedtls_mpi_core_sub(in_RDI,(mbedtls_mpi_uint *)u1,in_R8,in_R9);
  mbedtls_ct_bool(x);
  mbedtls_ct_memcpy_if(in_RSI,(uchar *)in_RDX,in_RCX,(uchar *)in_R8,in_R9);
  return;
}

Assistant:

void mbedtls_mpi_core_montmul(mbedtls_mpi_uint *X,
                              const mbedtls_mpi_uint *A,
                              const mbedtls_mpi_uint *B,
                              size_t B_limbs,
                              const mbedtls_mpi_uint *N,
                              size_t AN_limbs,
                              mbedtls_mpi_uint mm,
                              mbedtls_mpi_uint *T)
{
    memset(T, 0, (2 * AN_limbs + 1) * ciL);

    for (size_t i = 0; i < AN_limbs; i++) {
        /* T = (T + u0*B + u1*N) / 2^biL */
        mbedtls_mpi_uint u0 = A[i];
        mbedtls_mpi_uint u1 = (T[0] + u0 * B[0]) * mm;

        (void) mbedtls_mpi_core_mla(T, AN_limbs + 2, B, B_limbs, u0);
        (void) mbedtls_mpi_core_mla(T, AN_limbs + 2, N, AN_limbs, u1);

        T++;
    }

    /*
     * The result we want is (T >= N) ? T - N : T.
     *
     * For better constant-time properties in this function, we always do the
     * subtraction, with the result in X.
     *
     * We also look to see if there was any carry in the final additions in the
     * loop above.
     */

    mbedtls_mpi_uint carry  = T[AN_limbs];
    mbedtls_mpi_uint borrow = mbedtls_mpi_core_sub(X, T, N, AN_limbs);

    /*
     * Using R as the Montgomery radix (auxiliary modulus) i.e. 2^(biL*AN_limbs):
     *
     * T can be in one of 3 ranges:
     *
     * 1) T < N      : (carry, borrow) = (0, 1): we want T
     * 2) N <= T < R : (carry, borrow) = (0, 0): we want X
     * 3) T >= R     : (carry, borrow) = (1, 1): we want X
     *
     * and (carry, borrow) = (1, 0) can't happen.
     *
     * So the correct return value is already in X if (carry ^ borrow) = 0,
     * but is in (the lower AN_limbs limbs of) T if (carry ^ borrow) = 1.
     */
    mbedtls_ct_memcpy_if(mbedtls_ct_bool(carry ^ borrow),
                         (unsigned char *) X,
                         (unsigned char *) T,
                         NULL,
                         AN_limbs * sizeof(mbedtls_mpi_uint));
}